

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_clause.cpp
# Opt level: O2

bool duckdb::AtClause::Equals
               (optional_ptr<duckdb::AtClause,_true> lhs,optional_ptr<duckdb::AtClause,_true> rhs)

{
  bool bVar1;
  AtClause *this;
  AtClause *other;
  long in_RSI;
  long in_RDI;
  optional_ptr<duckdb::AtClause,_true> local_18;
  optional_ptr<duckdb::AtClause,_true> local_10;
  
  if (in_RDI == in_RSI) {
    bVar1 = true;
  }
  else if (in_RSI == 0 || in_RDI == 0) {
    bVar1 = false;
  }
  else {
    this = optional_ptr<duckdb::AtClause,_true>::operator->(&local_10);
    other = optional_ptr<duckdb::AtClause,_true>::operator*(&local_18);
    bVar1 = Equals(this,other);
  }
  return bVar1;
}

Assistant:

bool AtClause::Equals(optional_ptr<AtClause> lhs, optional_ptr<AtClause> rhs) {
	if (lhs.get() == rhs.get()) {
		// same pointer OR both are null
		return true;
	}
	if (!lhs || !rhs) {
		// one is NULL other is not - always not equal
		return false;
	}
	return lhs->Equals(*rhs);
}